

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaReleaseLast(ExtensionSet *this,int number)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar4;
  Rep *pRVar5;
  MessageLite *pMVar6;
  Extension *pEVar7;
  LogMessage *pLVar8;
  LogFinisher local_139;
  LogMessage local_138;
  LogMessage local_100;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  pEVar7 = FindOrNull(this,number);
  if (pEVar7 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,899);
    pLVar8 = LogMessage::operator<<(&local_90,"CHECK failed: extension != nullptr: ");
    pLVar8 = LogMessage::operator<<(pLVar8,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=((LogFinisher *)&local_138,pLVar8);
    LogMessage::~LogMessage(&local_90);
  }
  if (pEVar7->is_repeated == false) {
    LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,900);
    pLVar8 = LogMessage::operator<<(&local_c8,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=((LogFinisher *)&local_138,pLVar8);
    LogMessage::~LogMessage(&local_c8);
  }
  bVar1 = pEVar7->type;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x3f);
    pLVar8 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=((LogFinisher *)&local_138,pLVar8);
    LogMessage::~LogMessage(&local_58);
  }
  if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
    LogMessage::LogMessage
              (&local_100,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x385);
    pLVar8 = LogMessage::operator<<
                       (&local_100,
                        "CHECK failed: cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE: "
                       );
    LogFinisher::operator=((LogFinisher *)&local_138,pLVar8);
    LogMessage::~LogMessage(&local_100);
  }
  pRVar4 = (pEVar7->field_0).repeated_string_value;
  if ((pRVar4->super_RepeatedPtrFieldBase).current_size_ < 1) {
    LogMessage::LogMessage
              (&local_138,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4a2);
    pLVar8 = LogMessage::operator<<(&local_138,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=(&local_139,pLVar8);
    LogMessage::~LogMessage(&local_138);
  }
  pRVar5 = (pRVar4->super_RepeatedPtrFieldBase).rep_;
  iVar2 = (pRVar4->super_RepeatedPtrFieldBase).current_size_;
  (pRVar4->super_RepeatedPtrFieldBase).current_size_ = iVar2 + -1;
  pMVar6 = (MessageLite *)pRVar5->elements[(long)iVar2 + -1];
  iVar3 = pRVar5->allocated_size;
  pRVar5->allocated_size = iVar3 + -1;
  if (iVar2 < iVar3) {
    pRVar5->elements[(long)iVar2 + -1] = pRVar5->elements[(long)iVar3 + -1];
  }
  return pMVar6;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) {
  const auto* const_this = this;
  return const_cast<ExtensionSet::Extension*>(const_this->FindOrNull(key));
}